

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O0

void xercesc_4_0::XTemplateSerializer::loadObject
               (RefVectorOf<xercesc_4_0::XMLNumber> **objToLoad,int initSize,bool toAdopt,
               NumberType numType,XSerializeEngine *serEng)

{
  byte bVar1;
  bool bVar2;
  MemoryManager *pMVar3;
  RefVectorOf<xercesc_4_0::XMLNumber> *this;
  XMLSize_t maxElems;
  XMLNumber *toAdd;
  XMLNumber *data;
  XMLSize_t i;
  XMLSize_t vectorLength;
  XSerializeEngine *local_28;
  XSerializeEngine *serEng_local;
  byte local_15;
  NumberType numType_local;
  bool toAdopt_local;
  RefVectorOf<xercesc_4_0::XMLNumber> **ppRStack_10;
  int initSize_local;
  RefVectorOf<xercesc_4_0::XMLNumber> **objToLoad_local;
  
  local_28 = serEng;
  serEng_local._4_4_ = numType;
  local_15 = toAdopt;
  numType_local = initSize;
  ppRStack_10 = objToLoad;
  bVar2 = XSerializeEngine::needToLoadObject(serEng,objToLoad);
  if (bVar2) {
    if (*ppRStack_10 == (RefVectorOf<xercesc_4_0::XMLNumber> *)0x0) {
      if ((int)numType_local < 0) {
        numType_local = 0x10;
      }
      pMVar3 = XSerializeEngine::getMemoryManager(local_28);
      this = (RefVectorOf<xercesc_4_0::XMLNumber> *)XMemory::operator_new(0x30,pMVar3);
      bVar1 = local_15;
      maxElems = (XMLSize_t)(int)numType_local;
      pMVar3 = XSerializeEngine::getMemoryManager(local_28);
      RefVectorOf<xercesc_4_0::XMLNumber>::RefVectorOf(this,maxElems,(bool)(bVar1 & 1),pMVar3);
      *ppRStack_10 = this;
    }
    XSerializeEngine::registerObject(local_28,*ppRStack_10);
    i = 0;
    XSerializeEngine::readSize(local_28,&i);
    for (data = (XMLNumber *)0x0; data < i;
        data = (XMLNumber *)((long)&(data->super_XSerializable)._vptr_XSerializable + 1)) {
      toAdd = XMLNumber::loadNumber(serEng_local._4_4_,local_28);
      BaseRefVectorOf<xercesc_4_0::XMLNumber>::addElement
                (&(*ppRStack_10)->super_BaseRefVectorOf<xercesc_4_0::XMLNumber>,toAdd);
    }
  }
  return;
}

Assistant:

void XTemplateSerializer::loadObject(RefVectorOf<XMLNumber>** objToLoad
                                   , int                       initSize
                                   , bool                      toAdopt
                                   , XMLNumber::NumberType     numType
                                   , XSerializeEngine&         serEng)
{

    if (serEng.needToLoadObject((void**)objToLoad))
    {
        if (!*objToLoad)
        {
            if (initSize < 0)
                initSize = 16;

            *objToLoad = new (serEng.getMemoryManager())
                             RefVectorOf<XMLNumber>(
                                                    initSize
                                                  , toAdopt
                                                  , serEng.getMemoryManager()
                                                   );
        }

        serEng.registerObject(*objToLoad);

        XMLSize_t vectorLength = 0;
        serEng.readSize (vectorLength);
        for (XMLSize_t i = 0 ; i < vectorLength; i++)
        {
            XMLNumber*  data;
            data = XMLNumber::loadNumber(numType , serEng);
            (*objToLoad)->addElement(data);
        }
    }

}